

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O0

bool __thiscall JSON::JSONScanner::IsJSONNumber(JSONScanner *this)

{
  char16 cVar1;
  bool bVar2;
  char16 nch;
  bool firstDigitIsAZero;
  JSONScanner *this_local;
  
  cVar1 = PeekNextChar(this);
  bVar2 = cVar1 == L'0';
  if (bVar2) {
    this->currentChar = this->currentChar + 1;
  }
  while( true ) {
    if (this->inputText + this->inputLen <= this->currentChar) {
      return true;
    }
    cVar1 = ReadNextChar(this);
    if (cVar1 == L'\0') {
      return false;
    }
    if ((ushort)cVar1 == 0x2e) break;
    if (9 < (ushort)cVar1 - 0x30) {
      return true;
    }
    if (bVar2) {
      return false;
    }
    bVar2 = false;
  }
  if (this->inputText + this->inputLen <= this->currentChar) {
    return false;
  }
  cVar1 = ReadNextChar(this);
  if ((0x2f < (ushort)cVar1) && ((ushort)cVar1 < 0x3a)) {
    return true;
  }
  return false;
}

Assistant:

bool JSONScanner::IsJSONNumber()
    {
        bool firstDigitIsAZero = false;
        if (PeekNextChar() == '0')
        {
            firstDigitIsAZero = true;
            currentChar++;
        }

        //partial verification of number JSON grammar.
        while (currentChar < inputText + inputLen)
        {
            switch(ReadNextChar())
            {
            case 0:
                return false;
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                if (firstDigitIsAZero)
                {
                    return false;
                }
                break;

            case '.':
                {
                    // at least one digit after '.'
                    if(currentChar < inputText + inputLen)
                    {
                        char16 nch = ReadNextChar();
                        if('0' <= nch && nch <= '9')
                        {
                            return true;
                        }
                        else
                        {
                            return false;
                        }
                    }
                    else
                    {
                        return false;
                    }
                }
                //case 'E':
                //case 'e':
                //    return true;
            default:
                return true;
            }

            firstDigitIsAZero = false;
        }
        return true;
    }